

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> * __thiscall
kj::Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
          (Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *this)

{
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *this_local;
  
  kj::_::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator=
            (&this->ptr,(void *)0x0);
  return this;
}

Assistant:

inline Maybe& operator=(kj::None) { ptr = nullptr; return *this; }